

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextureBase.hpp
# Opt level: O3

void __thiscall
Diligent::TextureBase<Diligent::EngineVkImplTraits>::DestroyDefaultViews
          (TextureBase<Diligent::EngineVkImplTraits> *this)

{
  void **ppvVar1;
  BIND_FLAGS BVar2;
  TextureViewVkImpl *this_00;
  RenderDeviceVkImpl *pRVar3;
  IMemoryAllocator *pIVar4;
  uint uVar5;
  FixedBlockMemoryAllocator *this_01;
  void **ppvVar6;
  BIND_FLAGS BVar7;
  ulong uVar8;
  string msg;
  string local_50;
  
  if ((void **)this->m_pDefaultViews != (void **)0x0) {
    ppvVar1 = &this->m_pDefaultViews;
    BVar2 = (this->
            super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
            ).m_Desc.BindFlags;
    BVar7 = BVar2 & (BIND_FLAG_LAST|BIND_UNORDERED_ACCESS|BIND_DEPTH_STENCIL|BIND_RENDER_TARGET|
                    BIND_SHADER_RESOURCE);
    uVar5 = BVar7 - (BVar2 >> 1 & 0x454);
    uVar5 = (uVar5 >> 2 & 0x33333333) + (uVar5 & 0x33333330);
    uVar5 = ((uVar5 >> 4) + uVar5 & 0xf0f0f0f) * 0x1010101 >> 0x18;
    ppvVar6 = (void **)this->m_pDefaultViews;
    if (uVar5 < 2) {
      ppvVar6 = ppvVar1;
    }
    pRVar3 = DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
             ::GetDevice(&this->
                          super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                        );
    this_01 = &(pRVar3->
               super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
               ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_TexViewObjAllocator;
    if (this_01 != this->m_dbgTexViewObjAllocator) {
      FormatString<char[87]>
                (&local_50,
                 (char (*) [87])
                 "Texture view allocator does not match allocator provided during texture initialization"
                );
      DebugAssertionFailed
                (local_50._M_dataplus._M_p,"DestroyDefaultViews",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/TextureBase.hpp"
                 ,0x161);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
    if (BVar7 != BIND_NONE) {
      uVar8 = 0;
      do {
        this_00 = (TextureViewVkImpl *)ppvVar6[uVar8];
        if (this_00 != (TextureViewVkImpl *)0x0) {
          TextureViewVkImpl::~TextureViewVkImpl(this_00);
          FixedBlockMemoryAllocator::Free(this_01,this_00);
        }
        uVar8 = uVar8 + 1;
      } while (uVar5 + (uVar5 == 0) != uVar8);
    }
    if (1 < uVar5) {
      pIVar4 = GetRawAllocator();
      (*pIVar4->_vptr_IMemoryAllocator[1])(pIVar4,*ppvVar1);
    }
    *ppvVar1 = (void *)0x0;
  }
  return;
}

Assistant:

void DestroyDefaultViews()
    {
        if (m_pDefaultViews == nullptr)
            return;

        const Uint32          NumViews       = GetNumDefaultViews();
        TextureViewImplType** ppDefaultViews = GetDefaultViewsArrayPtr();

        TexViewObjAllocatorType& TexViewAllocator = this->GetDevice()->GetTexViewObjAllocator();
        VERIFY(&TexViewAllocator == &m_dbgTexViewObjAllocator, "Texture view allocator does not match allocator provided during texture initialization");

        for (Uint32 i = 0; i < NumViews; ++i)
        {
            if (TextureViewImplType* pView = ppDefaultViews[i])
            {
                pView->~TextureViewImplType();
                TexViewAllocator.Free(pView);
            }
        }

        if (NumViews > 1)
        {
            GetRawAllocator().Free(m_pDefaultViews);
        }

        m_pDefaultViews = nullptr;
    }